

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

iterator * __thiscall QTextBlock::iterator::operator--(iterator *this)

{
  int iVar1;
  int iVar2;
  QTextDocumentPrivate *pQVar3;
  uint n;
  uint uVar4;
  ulong uVar5;
  
  n = QFragmentMapData<QTextFragmentData>::previous(&(this->p->fragments).data,this->n);
  this->n = n;
  if (n != this->b) {
    uVar5 = (ulong)(uint)this->n;
    if (this->n != this->b) {
      iVar1 = (this->p->fragments).data.field_0.fragments[n].format;
      pQVar3 = this->p;
      iVar2 = (pQVar3->fragments).data.field_0.fragments[uVar5].format;
      while (iVar2 != iVar1) {
        n = (uint)uVar5;
        uVar4 = QFragmentMapData<QTextFragmentData>::previous(&(pQVar3->fragments).data,n);
        uVar5 = (ulong)uVar4;
        this->n = uVar4;
        if (uVar4 == this->b) break;
        pQVar3 = this->p;
        iVar2 = (pQVar3->fragments).data.field_0.fragments[uVar4].format;
      }
    }
    this->n = n;
  }
  return this;
}

Assistant:

QTextBlock::iterator &QTextBlock::iterator::operator--()
{
    n = p->fragmentMap().previous(n);

    if (n == b)
        return *this;

    int formatIndex = p->fragmentMap().fragment(n)->format;
    int last = n;

    while (n != b && p->fragmentMap().fragment(n)->format != formatIndex) {
        last = n;
        n = p->fragmentMap().previous(n);
    }

    n = last;
    return *this;
}